

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.hh
# Opt level: O0

void __thiscall ActionRestructureHigh::ActionRestructureHigh(ActionRestructureHigh *this,string *g)

{
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *g_local;
  ActionRestructureHigh *this_local;
  
  local_18 = g;
  g_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"restructure_high",&local_39);
  Action::Action(&this->super_Action,0,(string *)local_38,local_18);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_Action)._vptr_Action = (_func_int **)&PTR__ActionRestructureHigh_00854a30;
  return;
}

Assistant:

virtual Action *clone(const ActionGroupList &grouplist) const {
    if (!grouplist.contains(getGroup())) return (Action *)0;
    return new ActionRestructureHigh(getGroup());
  }